

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O3

void socketreceiver_read(_socketreceiver *x,int fd)

{
  char cVar1;
  _binbuf *x_00;
  uint uVar2;
  char *pcVar3;
  _instanceinter *p_Var4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  size_t size;
  ssize_t sVar8;
  int iVar9;
  uint uVar10;
  int __status;
  socklen_t *psVar11;
  uint uVar12;
  size_t size_00;
  uint uVar13;
  uchar *__s;
  socklen_t fromaddrlen;
  undefined4 local_1038;
  
  p_Var4 = pd_maininstance.pd_inter;
  if (x->sr_udp == 0) {
    iVar9 = x->sr_inhead;
    iVar5 = 0x1000;
    if (iVar9 < x->sr_intail) {
      iVar5 = x->sr_intail + -1;
    }
    if (iVar5 == iVar9) {
      socketreceiver_read_cold_2();
    }
    else {
      __status = fd;
      sVar8 = recv(fd,x->sr_inbuf + iVar9,(long)(iVar5 - iVar9),0);
      iVar9 = (int)sVar8;
      if (iVar9 < 1) {
        if (iVar9 < 0) {
          __status = 0x1ba525;
          sys_sockerror("recv (tcp)");
        }
        if ((pd_maininstance.pd_inter)->i_socketreceiver != x) {
          if (x->sr_notifier != (t_socketnotifier)0x0) {
            (*x->sr_notifier)(x->sr_owner,fd);
          }
          sys_rmpollfn(fd);
          socket_close(fd);
          return;
        }
        socketreceiver_read_cold_1();
        if (sys_bail_reentered != '\0') {
          _exit(1);
        }
        sys_bail_reentered = '\x01';
        exit(__status);
      }
      uVar10 = iVar9 + x->sr_inhead;
      if (0xfff < (int)uVar10) {
        uVar10 = 0;
      }
      x->sr_inhead = uVar10;
      uVar13 = x->sr_intail;
      do {
        pcVar7 = x->sr_inbuf;
        size_00 = 1;
        pcVar3 = (char *)&local_1038;
        while( true ) {
          cVar1 = pcVar7[(int)uVar13];
          *pcVar3 = cVar1;
          if ((cVar1 == ';') && ((uVar13 == 0 || (pcVar7[(long)(int)uVar13 + -1] != '\\')))) break;
          uVar13 = uVar13 + 1 & 0xfff;
          size_00 = size_00 + 1;
          pcVar3 = pcVar3 + 1;
          if (uVar13 == uVar10) {
            return;
          }
        }
        binbuf_text((pd_maininstance.pd_inter)->i_inbinbuf,(char *)&local_1038,size_00);
        if ((sys_debuglevel & 2U) != 0) {
          uVar12 = (uint)size_00;
          if (pcVar3 + 1 <= &local_1038) {
            uVar12 = 0;
          }
          uVar2 = uVar12 - 2;
          if (local_1038._1_1_ != '\n' || (char)local_1038 != '\r') {
            uVar2 = uVar12;
          }
          pcVar7 = "<< %.*s\n";
          if (stderr_isatty != 0) {
            pcVar7 = "\x1b[0;1;36m<< %.*s\x1b[0m\n";
          }
          if ((sys_debuglevel & 4U) == 0) {
            pcVar7 = "<< %.*s\n";
          }
          fprintf(_stderr,pcVar7,(ulong)uVar2);
        }
        x->sr_inhead = uVar10;
        x->sr_intail = uVar13 + 1 & 0xfff;
        if (x->sr_fromaddrfn != (t_socketfromaddrfn)0x0) {
          local_1038 = 0x80;
          iVar9 = getpeername(fd,(sockaddr *)x->sr_fromaddr,&local_1038);
          if (iVar9 == 0) {
            (*x->sr_fromaddrfn)(x->sr_owner,x->sr_fromaddr);
          }
        }
        outlet_setstacklim();
        if (x->sr_socketreceivefn == (t_socketreceivefn)0x0) {
          binbuf_eval((pd_maininstance.pd_inter)->i_inbinbuf,(t_pd *)0x0,0,(t_atom *)0x0);
        }
        else {
          (*x->sr_socketreceivefn)(x->sr_owner,(pd_maininstance.pd_inter)->i_inbinbuf);
        }
        uVar10 = x->sr_inhead;
        uVar13 = x->sr_intail;
      } while (uVar10 != uVar13);
    }
  }
  else {
    __s = (pd_maininstance.pd_inter)->i_recvbuf;
    psVar11 = &local_1038;
    local_1038 = 0x80;
    if (x->sr_fromaddr == (sockaddr_storage *)0x0) {
      psVar11 = (socklen_t *)0x0;
    }
    uVar6 = recvfrom(fd,__s,0xffff,0,(sockaddr *)x->sr_fromaddr,psVar11);
    if (-1 < (int)uVar6) {
      iVar9 = 0;
      do {
        if ((uint)uVar6 != 0) {
          if (0xffff < (uint)uVar6) {
            post("warning: incoming UDP packet truncated from %d to %d bytes.",uVar6 & 0xffffffff,
                 0xffff);
            uVar6 = 0xffff;
          }
          __s[uVar6 & 0xffffffff] = '\0';
          if (p_Var4->i_recvbuf[(uVar6 & 0xffffffff) - 1] == '\n') {
            pcVar7 = strchr((char *)__s,0x3b);
            if (pcVar7 != (char *)0x0) {
              *pcVar7 = '\0';
            }
            if (x->sr_fromaddrfn != (t_socketfromaddrfn)0x0) {
              (*x->sr_fromaddrfn)(x->sr_owner,x->sr_fromaddr);
            }
            x_00 = (pd_maininstance.pd_inter)->i_inbinbuf;
            size = strlen((char *)__s);
            binbuf_text(x_00,(char *)__s,size);
            outlet_setstacklim();
            if (x->sr_socketreceivefn == (t_socketreceivefn)0x0) {
              bug("socketreceiver_getudp");
            }
            else {
              (*x->sr_socketreceivefn)(x->sr_owner,(pd_maininstance.pd_inter)->i_inbinbuf);
            }
          }
          iVar9 = (int)uVar6 + iVar9;
          if (0xffff < iVar9) {
            return;
          }
          iVar5 = socket_bytes_available(fd);
          if (iVar5 < 1) {
            return;
          }
        }
        psVar11 = &local_1038;
        if (x->sr_fromaddr == (sockaddr_storage *)0x0) {
          psVar11 = (socklen_t *)0x0;
        }
        uVar6 = recvfrom(fd,__s,0xffff,0,(sockaddr *)x->sr_fromaddr,psVar11);
      } while (-1 < (int)uVar6);
    }
    iVar9 = socket_errno_udp();
    if (iVar9 != 0) {
      sys_sockerror("recv (udp)");
      if (x->sr_notifier != (t_socketnotifier)0x0) {
        (*x->sr_notifier)(x->sr_owner,fd);
        sys_rmpollfn(fd);
        socket_close(fd);
      }
    }
  }
  return;
}

Assistant:

void socketreceiver_read(t_socketreceiver *x, int fd)
{
    if (x->sr_udp)   /* UDP ("datagram") socket protocol */
        socketreceiver_getudp(x, fd);
    else  /* TCP ("streaming") socket protocol */
    {
        char *semi;
        int readto =
            (x->sr_inhead >= x->sr_intail ? INBUFSIZE : x->sr_intail-1);
        int ret;

            /* the input buffer might be full. If so, drop the whole thing */
        if (readto == x->sr_inhead)
        {
            fprintf(stderr, "pd: dropped message from gui\n");
            x->sr_inhead = x->sr_intail = 0;
            readto = INBUFSIZE;
        }
        else
        {
            ret = (int)recv(fd, x->sr_inbuf + x->sr_inhead,
                readto - x->sr_inhead, 0);
            if (ret <= 0)
            {
                if (ret < 0)
                    sys_sockerror("recv (tcp)");
                if (x == INTER->i_socketreceiver)
                {
                    if (pd_this == &pd_maininstance)
                    {
                        fprintf(stderr, "read from GUI socket: %s; stopping\n",
                            strerror(errno));
                        sys_bail(1);
                    }
                    else
                    {
                        sys_rmpollfn(fd);
                        sys_closesocket(fd);
                        sys_stopgui();
                    }
                }
                else
                {
                    if (x->sr_notifier)
                        (*x->sr_notifier)(x->sr_owner, fd);
                    sys_rmpollfn(fd);
                    sys_closesocket(fd);
                }
            }
            else
            {
                x->sr_inhead += ret;
                if (x->sr_inhead >= INBUFSIZE) x->sr_inhead = 0;
                while (socketreceiver_doread(x))
                {
                    if (x->sr_fromaddrfn)
                    {
                        socklen_t fromaddrlen = sizeof(struct sockaddr_storage);
                        if(!getpeername(fd,
                                        (struct sockaddr *)x->sr_fromaddr,
                                        &fromaddrlen))
                            (*x->sr_fromaddrfn)(x->sr_owner,
                                (const void *)x->sr_fromaddr);
                    }
                    outlet_setstacklim();
                    if (x->sr_socketreceivefn)
                        (*x->sr_socketreceivefn)(x->sr_owner,
                            INTER->i_inbinbuf);
                    else binbuf_eval(INTER->i_inbinbuf, 0, 0, 0);
                    if (x->sr_inhead == x->sr_intail)
                        break;
                }
            }
        }
    }
}